

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O2

stream * copy_stream(stream *s)

{
  long lVar1;
  uint16_t uVar2;
  stream *psVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar3 = init_stream((uint16_t)s->size);
  memcpy(psVar3->stream,s->stream,s->size);
  uVar2 = s->r_head;
  psVar3->w_head = s->w_head;
  psVar3->r_head = uVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return psVar3;
  }
  __stack_chk_fail();
}

Assistant:

struct stream *copy_stream(struct stream *s)
{
	struct stream *cpy = init_stream(s->size);

	memcpy(cpy->stream, s->stream, s->size);
	cpy->w_head = s->w_head;
	cpy->r_head = s->r_head;
	return cpy;
}